

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

void __thiscall slang::ast::ScalarType::ScalarType(ScalarType *this,Kind scalarKind,bool isSigned)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = 3;
  if (scalarKind == Bit) {
    pcVar2 = "bit";
  }
  else if (scalarKind == Reg) {
    pcVar2 = "reg";
  }
  else {
    pcVar2 = "logic";
    sVar1 = 5;
  }
  (this->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.kind = ScalarType;
  (this->super_IntegralType).super_Type.super_Symbol.name._M_len = sVar1;
  (this->super_IntegralType).super_Type.super_Symbol.name._M_str = pcVar2;
  (this->super_IntegralType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(this->super_IntegralType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->super_IntegralType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->super_IntegralType).super_Type.canonical = (Type *)this;
  (this->super_IntegralType).bitWidth = 1;
  (this->super_IntegralType).isSigned = isSigned;
  (this->super_IntegralType).isFourState = scalarKind != Bit;
  this->scalarKind = scalarKind;
  return;
}

Assistant:

ScalarType::ScalarType(Kind scalarKind, bool isSigned) :
    IntegralType(SymbolKind::ScalarType, getName(scalarKind), SourceLocation(), 1, isSigned,
                 scalarKind != Kind::Bit),
    scalarKind(scalarKind) {
}